

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int wally_descriptor_to_scriptpubkey
              (char *descriptor,char **key_name_array,char **key_value_array,size_t array_len,
              uint32_t derive_child_num,uint32_t network,uint32_t target_depth,uint32_t target_index
              ,uint32_t flags,uchar *script,size_t script_len,size_t *written)

{
  int iVar1;
  long lVar2;
  char **in_stack_ffffffffffffff98;
  uint32_t *local_60;
  uint32_t network_local;
  size_t local_50;
  wally_descriptor_script_item script_item;
  
  iVar1 = -2;
  if (((script_len != 0) && (script != (uchar *)0x0)) && (written != (size_t *)0x0)) {
    local_60 = &network_local;
    if (network != 0xff) {
      lVar2 = 0;
      do {
        if ((&g_network_address_table[0].network)[lVar2] == network) goto LAB_001078d7;
        lVar2 = lVar2 + 0x10;
      } while (lVar2 != 0x50);
      local_60 = (uint32_t *)0x0;
    }
LAB_001078d7:
    *written = 0;
    network_local = network;
    local_50 = array_len;
    wally_bzero(&script_item,0x18);
    script_item.script = script;
    script_item.script_len = script_len;
    script_item.child_num = derive_child_num;
    iVar1 = parse_miniscript(descriptor,key_name_array,key_value_array,local_50,flags,3,local_60,
                             target_depth,target_index,&script_item,1,(uint32_t *)0x0,
                             in_stack_ffffffffffffff98);
    if (iVar1 == 0) {
      *written = script_item.script_len;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_descriptor_to_scriptpubkey(
    const char *descriptor,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t derive_child_num,
    uint32_t network,
    uint32_t target_depth,
    uint32_t target_index,
    uint32_t flags,
    unsigned char *script,
    size_t script_len,
    size_t *written)
{
    int ret;
    size_t index;
    size_t addr_tbl_max = sizeof(g_network_address_table) / sizeof(struct address_script_t);
    const struct address_script_t *addr_item = NULL;
    struct wally_descriptor_script_item script_item;

    if (!script || !written || !script_len)
        return WALLY_EINVAL;

    if (network == WALLY_NETWORK_BITCOIN_REGTEST)
        addr_item = &g_network_address_table[2];  /* bitcoin regtest */
    else
        for (index = 0; index < addr_tbl_max; ++index) {
            if (network == (uint32_t)g_network_address_table[index].network) {
                addr_item = &g_network_address_table[index];
                break;
            }
        }

    if (written)
        *written = 0;

    wally_bzero(&script_item, sizeof(script_item));
    script_item.child_num = derive_child_num;
    script_item.script = script;
    script_item.script_len = script_len;

    ret = parse_miniscript(
        descriptor,
        key_name_array,
        key_value_array,
        array_len,
        flags,
        DESCRIPTOR_KIND_MINISCRIPT | DESCRIPTOR_KIND_DESCRIPTOR,
        (!addr_item) ? NULL : &network,
        target_depth,
        target_index,
        &script_item,
        1,
        NULL,
        NULL);
    if (ret == WALLY_OK)
        *written = script_item.script_len;
    return ret;
}